

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::AttachResponse>::Bind
          (Deferred<perfetto::protos::gen::AttachResponse> *this,
          function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)>
          *callback)

{
  bool bVar1;
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> local_58;
  undefined1 local_38 [8];
  anon_class_32_1_dda845c3 callback_adapter;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)> *callback_local
  ;
  Deferred<perfetto::protos::gen::AttachResponse> *this_local;
  
  callback_adapter.callback._M_invoker = (_Invoker_type)callback;
  bVar1 = ::std::function::operator_cast_to_bool((function *)callback);
  if (bVar1) {
    std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)>::
    function((function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)> *)
             local_38,callback);
    ::std::function<void(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::
    function<perfetto::ipc::Deferred<perfetto::protos::gen::AttachResponse>::Bind(std::function<void(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)>)::_lambda(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)_1_&,void>
              ((function<void(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)&local_58,
               (anon_class_32_1_dda845c3 *)local_38);
    DeferredBase::Bind(&this->super_DeferredBase,&local_58);
    std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function(&local_58)
    ;
    Bind(std::function<void(perfetto::ipc::AsyncResult<perfetto::protos::gen::AttachResponse>)>)::
    {lambda(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)#1}::~function
              ((_lambda_perfetto__ipc__AsyncResult<protozero::CppMessageObj>__1_ *)local_38);
  }
  return;
}

Assistant:

void Bind(std::function<void(AsyncResult<T>)> callback) {
    if (!callback)
      return;

    // Here we need a callback adapter to downcast the callback to a generic
    // callback that takes an AsyncResult<ProtoMessage>, so that it can be
    // stored in the base class |callback_|.
    auto callback_adapter = [callback](
                                AsyncResult<ProtoMessage> async_result_base) {
      // Upcast the async_result from <ProtoMessage> -> <T : ProtoMessage>.
      static_assert(std::is_base_of<ProtoMessage, T>::value, "T:ProtoMessage");
      AsyncResult<T> async_result(
          std::unique_ptr<T>(static_cast<T*>(async_result_base.release_msg())),
          async_result_base.has_more(), async_result_base.fd());
      callback(std::move(async_result));
    };
    DeferredBase::Bind(callback_adapter);
  }